

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void convertToWithoutRowidTable(Parse *pParse,Table *pTab)

{
  long lVar1;
  Vdbe *p;
  uint uVar2;
  int iVar3;
  VdbeOp *pVVar4;
  ExprList *pEVar5;
  char *pcVar6;
  Table *in_RSI;
  long *in_RDI;
  int n;
  ExprList *pList;
  Vdbe *v;
  sqlite3 *db;
  int j;
  int i;
  int nPk;
  Index *pPk;
  Index *pIdx;
  int in_stack_000000ec;
  ExprList *in_stack_000000f0;
  SrcList *in_stack_000000f8;
  Token *in_stack_00000100;
  Token *in_stack_00000108;
  Parse *in_stack_00000110;
  Token *in_stack_00000120;
  Expr *in_stack_00000128;
  int in_stack_00000130;
  int in_stack_00000138;
  char *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  sqlite3 *in_stack_ffffffffffffffa8;
  int local_4c;
  uint local_2c;
  int local_28;
  Index *local_20;
  Index *local_18;
  
  lVar1 = *in_RDI;
  p = (Vdbe *)in_RDI[2];
  if ((int)in_RDI[0x3a] != 0) {
    pVVar4 = sqlite3VdbeGetOp(p,(int)in_RDI[0x3a]);
    pVVar4->opcode = 'x';
  }
  if (*(int *)((long)in_RDI + 0x1d4) != 0) {
    pVVar4 = sqlite3VdbeGetOp(p,*(int *)((long)in_RDI + 0x1d4));
    pVVar4->opcode = '\x10';
  }
  if (in_RSI->iPKey < 0) {
    local_20 = sqlite3PrimaryKeyIndex(in_RSI);
    local_2c = 1;
    for (local_28 = 1; local_28 < (int)(uint)local_20->nKeyCol; local_28 = local_28 + 1) {
      iVar3 = hasColumn(local_20->aiColumn,local_2c,(int)local_20->aiColumn[local_28]);
      if (iVar3 == 0) {
        local_20->aiColumn[(int)local_2c] = local_20->aiColumn[local_28];
        local_2c = local_2c + 1;
      }
      else {
        local_20->nColumn = local_20->nColumn - 1;
      }
    }
    local_20->nKeyCol = (u16)local_2c;
  }
  else {
    pEVar5 = sqlite3ExprListAppend
                       ((Parse *)in_stack_ffffffffffffffa8,
                        (ExprList *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        (Expr *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (pEVar5 == (ExprList *)0x0) {
      return;
    }
    pcVar6 = sqlite3DbStrDup((sqlite3 *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                             in_stack_ffffffffffffff90);
    pEVar5->a->zName = pcVar6;
    pEVar5->a->sortOrder = (u8)in_RDI[0x3e];
    in_stack_ffffffffffffffa0 = 0;
    local_20 = sqlite3CreateIndex(in_stack_00000110,in_stack_00000108,in_stack_00000100,
                                  in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,
                                  in_stack_00000120,in_stack_00000128,in_stack_00000130,
                                  in_stack_00000138);
    if (local_20 == (Index *)0x0) {
      return;
    }
    local_20->field_0x5b = local_20->field_0x5b & 0xfc | 2;
    in_RSI->iPKey = -1;
  }
  local_20->field_0x5b = local_20->field_0x5b & 0xdf | 0x20;
  uVar2 = (uint)local_20->nKeyCol;
  if (*(char *)(lVar1 + 0xa3) == '\0') {
    for (local_28 = 0; local_28 < (int)uVar2; local_28 = local_28 + 1) {
      in_RSI->aCol[local_20->aiColumn[local_28]].notNull = '\x01';
    }
    local_20->field_0x5b = local_20->field_0x5b & 0xf7 | 8;
  }
  local_20->tnum = in_RSI->tnum;
  local_18 = in_RSI->pIndex;
  do {
    if (local_18 == (Index *)0x0) {
      if ((int)uVar2 < (int)in_RSI->nCol) {
        iVar3 = resizeIndexObject(in_stack_ffffffffffffffa8,
                                  (Index *)CONCAT44(in_stack_ffffffffffffffa4,
                                                    in_stack_ffffffffffffffa0),
                                  in_stack_ffffffffffffff9c);
        if (iVar3 == 0) {
          local_2c = uVar2;
          for (local_28 = 0; local_28 < in_RSI->nCol; local_28 = local_28 + 1) {
            iVar3 = hasColumn(local_20->aiColumn,local_2c,local_28);
            if (iVar3 == 0) {
              local_20->aiColumn[(int)local_2c] = (i16)local_28;
              local_20->azColl[(int)local_2c] = "BINARY";
              local_2c = local_2c + 1;
            }
          }
        }
      }
      else {
        local_20->nColumn = in_RSI->nCol;
      }
      return;
    }
    if ((local_18->field_0x5b & 3) != 2) {
      local_4c = 0;
      for (local_28 = 0; local_28 < (int)uVar2; local_28 = local_28 + 1) {
        iVar3 = hasColumn(local_18->aiColumn,(uint)local_18->nKeyCol,
                          (int)local_20->aiColumn[local_28]);
        if (iVar3 == 0) {
          local_4c = local_4c + 1;
        }
      }
      if (local_4c == 0) {
        local_18->nColumn = local_18->nKeyCol;
      }
      else {
        iVar3 = resizeIndexObject(in_stack_ffffffffffffffa8,
                                  (Index *)CONCAT44(in_stack_ffffffffffffffa4,
                                                    in_stack_ffffffffffffffa0),
                                  in_stack_ffffffffffffff9c);
        if (iVar3 != 0) {
          return;
        }
        local_28 = 0;
        local_2c = (uint)local_18->nKeyCol;
        for (; local_28 < (int)uVar2; local_28 = local_28 + 1) {
          iVar3 = hasColumn(local_18->aiColumn,(uint)local_18->nKeyCol,
                            (int)local_20->aiColumn[local_28]);
          if (iVar3 == 0) {
            local_18->aiColumn[(int)local_2c] = local_20->aiColumn[local_28];
            local_18->azColl[(int)local_2c] = local_20->azColl[local_28];
            local_2c = local_2c + 1;
          }
        }
      }
    }
    local_18 = local_18->pNext;
  } while( true );
}

Assistant:

static void convertToWithoutRowidTable(Parse *pParse, Table *pTab){
  Index *pIdx;
  Index *pPk;
  int nPk;
  int i, j;
  sqlite3 *db = pParse->db;
  Vdbe *v = pParse->pVdbe;

  /* Convert the OP_CreateTable opcode that would normally create the
  ** root-page for the table into an OP_CreateIndex opcode.  The index
  ** created will become the PRIMARY KEY index.
  */
  if( pParse->addrCrTab ){
    assert( v );
    sqlite3VdbeGetOp(v, pParse->addrCrTab)->opcode = OP_CreateIndex;
  }

  /* Bypass the creation of the PRIMARY KEY btree and the sqlite_master
  ** table entry.
  */
  if( pParse->addrSkipPK ){
    assert( v );
    sqlite3VdbeGetOp(v, pParse->addrSkipPK)->opcode = OP_Goto;
  }

  /* Locate the PRIMARY KEY index.  Or, if this table was originally
  ** an INTEGER PRIMARY KEY table, create a new PRIMARY KEY index. 
  */
  if( pTab->iPKey>=0 ){
    ExprList *pList;
    pList = sqlite3ExprListAppend(pParse, 0, 0);
    if( pList==0 ) return;
    pList->a[0].zName = sqlite3DbStrDup(pParse->db,
                                        pTab->aCol[pTab->iPKey].zName);
    pList->a[0].sortOrder = pParse->iPkSortOrder;
    assert( pParse->pNewTable==pTab );
    pPk = sqlite3CreateIndex(pParse, 0, 0, 0, pList, pTab->keyConf, 0, 0, 0, 0);
    if( pPk==0 ) return;
    pPk->idxType = SQLITE_IDXTYPE_PRIMARYKEY;
    pTab->iPKey = -1;
  }else{
    pPk = sqlite3PrimaryKeyIndex(pTab);
    /*
    ** Remove all redundant columns from the PRIMARY KEY.  For example, change
    ** "PRIMARY KEY(a,b,a,b,c,b,c,d)" into just "PRIMARY KEY(a,b,c,d)".  Later
    ** code assumes the PRIMARY KEY contains no repeated columns.
    */
    for(i=j=1; i<pPk->nKeyCol; i++){
      if( hasColumn(pPk->aiColumn, j, pPk->aiColumn[i]) ){
        pPk->nColumn--;
      }else{
        pPk->aiColumn[j++] = pPk->aiColumn[i];
      }
    }
    pPk->nKeyCol = j;
  }
  pPk->isCovering = 1;
  assert( pPk!=0 );
  nPk = pPk->nKeyCol;

  /* Make sure every column of the PRIMARY KEY is NOT NULL.  (Except,
  ** do not enforce this for imposter tables.) */
  if( !db->init.imposterTable ){
    for(i=0; i<nPk; i++){
      pTab->aCol[pPk->aiColumn[i]].notNull = 1;
    }
    pPk->uniqNotNull = 1;
  }

  /* The root page of the PRIMARY KEY is the table root page */
  pPk->tnum = pTab->tnum;

  /* Update the in-memory representation of all UNIQUE indices by converting
  ** the final rowid column into one or more columns of the PRIMARY KEY.
  */
  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    int n;
    if( IsPrimaryKeyIndex(pIdx) ) continue;
    for(i=n=0; i<nPk; i++){
      if( !hasColumn(pIdx->aiColumn, pIdx->nKeyCol, pPk->aiColumn[i]) ) n++;
    }
    if( n==0 ){
      /* This index is a superset of the primary key */
      pIdx->nColumn = pIdx->nKeyCol;
      continue;
    }
    if( resizeIndexObject(db, pIdx, pIdx->nKeyCol+n) ) return;
    for(i=0, j=pIdx->nKeyCol; i<nPk; i++){
      if( !hasColumn(pIdx->aiColumn, pIdx->nKeyCol, pPk->aiColumn[i]) ){
        pIdx->aiColumn[j] = pPk->aiColumn[i];
        pIdx->azColl[j] = pPk->azColl[i];
        j++;
      }
    }
    assert( pIdx->nColumn>=pIdx->nKeyCol+n );
    assert( pIdx->nColumn>=j );
  }

  /* Add all table columns to the PRIMARY KEY index
  */
  if( nPk<pTab->nCol ){
    if( resizeIndexObject(db, pPk, pTab->nCol) ) return;
    for(i=0, j=nPk; i<pTab->nCol; i++){
      if( !hasColumn(pPk->aiColumn, j, i) ){
        assert( j<pPk->nColumn );
        pPk->aiColumn[j] = i;
        pPk->azColl[j] = "BINARY";
        j++;
      }
    }
    assert( pPk->nColumn==j );
    assert( pTab->nCol==j );
  }else{
    pPk->nColumn = pTab->nCol;
  }
}